

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O1

void __thiscall despot::BaseRockSample::PrintAction(BaseRockSample *this)

{
  ostream *poVar1;
  long *plVar2;
  ostream *in_RDX;
  int in_ESI;
  
  if (in_ESI < 4) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (in_RDX,(char *)(&Compass::CompassString_abi_cxx11_)[(long)in_ESI * 4],
                        *(long *)(std::__cxx11::string::replace + (long)in_ESI * 0x20));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  if (in_ESI == 4) {
    std::__ostream_insert<char,std::char_traits<char>>(in_RDX,"Sample",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)in_RDX + -0x18) + (char)in_RDX);
    std::ostream::put((char)in_RDX);
    std::ostream::flush();
  }
  if (4 < in_ESI) {
    std::__ostream_insert<char,std::char_traits<char>>(in_RDX,"Check ",6);
    plVar2 = (long *)std::ostream::operator<<((ostream *)in_RDX,in_ESI + -5);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void BaseRockSample::PrintAction(ACT_TYPE action, ostream& out) const {
	if (action < E_SAMPLE)
		out << Compass::CompassString[action] << endl;
	if (action == E_SAMPLE)
		out << "Sample" << endl;
	if (action > E_SAMPLE)
		out << "Check " << (action - E_SAMPLE - 1) << endl;
}